

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Sigmoid_x86_avx::forward_inplace(Sigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  long lVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar16 [32];
  float fVar21;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  auVar38 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar6 = (undefined1 (*) [32])(sVar3 * uVar11 * sVar2 + (long)pvVar1);
    lVar9 = 0;
    for (iVar8 = 0; auVar37 = auVar38._0_16_, iVar8 + 7 < iVar7; iVar8 = iVar8 + 8) {
      auVar30 = *pauVar6;
      auVar16._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      auVar16._8_4_ = auVar30._8_4_ ^ 0x80000000;
      auVar16._12_4_ = auVar30._12_4_ ^ 0x80000000;
      auVar16._16_4_ = auVar30._16_4_ ^ 0x80000000;
      auVar16._20_4_ = auVar30._20_4_ ^ 0x80000000;
      auVar16._24_4_ = auVar30._24_4_ ^ 0x80000000;
      auVar16._28_4_ = auVar30._28_4_ ^ 0x80000000;
      auVar30._8_4_ = 0x42b0c0a5;
      auVar30._0_8_ = 0x42b0c0a542b0c0a5;
      auVar30._12_4_ = 0x42b0c0a5;
      auVar30._16_4_ = 0x42b0c0a5;
      auVar30._20_4_ = 0x42b0c0a5;
      auVar30._24_4_ = 0x42b0c0a5;
      auVar30._28_4_ = 0x42b0c0a5;
      auVar30 = vminps_avx(auVar16,auVar30);
      auVar31._8_4_ = 0xc2b0c0a5;
      auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar31._12_4_ = 0xc2b0c0a5;
      auVar31._16_4_ = 0xc2b0c0a5;
      auVar31._20_4_ = 0xc2b0c0a5;
      auVar31._24_4_ = 0xc2b0c0a5;
      auVar31._28_4_ = 0xc2b0c0a5;
      auVar4 = vmaxps_avx(auVar30,auVar31);
      auVar32._0_4_ = auVar4._0_4_ * 1.442695 + 0.5;
      auVar32._4_4_ = auVar4._4_4_ * 1.442695 + 0.5;
      auVar32._8_4_ = auVar4._8_4_ * 1.442695 + 0.5;
      auVar32._12_4_ = auVar4._12_4_ * 1.442695 + 0.5;
      auVar32._16_4_ = auVar4._16_4_ * 1.442695 + 0.5;
      auVar32._20_4_ = auVar4._20_4_ * 1.442695 + 0.5;
      auVar32._24_4_ = auVar4._24_4_ * 1.442695 + 0.5;
      auVar32._28_4_ = 0x3ff8aa3b;
      auVar16 = vroundps_avx(auVar32,1);
      auVar30 = vcmpps_avx(auVar32,auVar16,1);
      auVar36._8_4_ = 0x3f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._12_4_ = 0x3f800000;
      auVar36._16_4_ = 0x3f800000;
      auVar36._20_4_ = 0x3f800000;
      auVar36._24_4_ = 0x3f800000;
      auVar36._28_4_ = 0x3f800000;
      auVar30 = vandps_avx(auVar30,auVar36);
      auVar30 = vsubps_avx(auVar16,auVar30);
      fVar12 = auVar4._0_4_ + auVar30._0_4_ * -0.6931472;
      fVar19 = auVar4._4_4_ + auVar30._4_4_ * -0.6931472;
      fVar20 = auVar4._8_4_ + auVar30._8_4_ * -0.6931472;
      fVar21 = auVar4._12_4_ + auVar30._12_4_ * -0.6931472;
      fVar22 = auVar4._16_4_ + auVar30._16_4_ * -0.6931472;
      fVar23 = auVar4._20_4_ + auVar30._20_4_ * -0.6931472;
      fVar24 = auVar4._24_4_ + auVar30._24_4_ * -0.6931472;
      auVar25._0_4_ = (int)auVar30._0_4_;
      auVar25._4_4_ = (int)auVar30._4_4_;
      auVar25._8_4_ = (int)auVar30._8_4_;
      auVar25._12_4_ = (int)auVar30._12_4_;
      auVar33._16_4_ = (int)auVar30._16_4_;
      auVar33._0_16_ = auVar25;
      auVar33._20_4_ = (int)auVar30._20_4_;
      auVar33._24_4_ = (int)auVar30._24_4_;
      auVar33._28_4_ = (int)auVar30._28_4_;
      auVar34 = vpslld_avx(auVar25,0x17);
      auVar25 = vpslld_avx(auVar33._16_16_,0x17);
      auVar25 = vpaddd_avx(auVar25,auVar37);
      auVar37 = vpaddd_avx(auVar34,auVar37);
      auVar17._0_4_ =
           (fVar12 + 1.0 +
           fVar12 * fVar12 *
           (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
             0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar37._0_4_ + 1.0;
      auVar17._4_4_ =
           (fVar19 + 1.0 +
           fVar19 * fVar19 *
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar37._4_4_ + 1.0;
      auVar17._8_4_ =
           (fVar20 + 1.0 +
           fVar20 * fVar20 *
           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
             0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar37._8_4_ + 1.0;
      auVar17._12_4_ =
           (fVar21 + 1.0 +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar37._12_4_ + 1.0;
      auVar17._16_4_ =
           (fVar22 + 1.0 +
           fVar22 * fVar22 *
           (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
             0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar25._0_4_ + 1.0;
      auVar17._20_4_ =
           (fVar23 + 1.0 +
           fVar23 * fVar23 *
           (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
             0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5)) * auVar25._4_4_ + 1.0;
      auVar17._24_4_ =
           (fVar24 + 1.0 +
           fVar24 * fVar24 *
           (((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24 +
             0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5)) * auVar25._8_4_ + 1.0;
      auVar17._28_4_ = auVar4._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
      auVar30 = vrcpps_avx(auVar17);
      fVar12 = auVar30._0_4_;
      fVar19 = auVar30._4_4_;
      auVar4._4_4_ = auVar17._4_4_ * fVar19;
      auVar4._0_4_ = auVar17._0_4_ * fVar12;
      fVar20 = auVar30._8_4_;
      auVar4._8_4_ = auVar17._8_4_ * fVar20;
      fVar21 = auVar30._12_4_;
      auVar4._12_4_ = auVar17._12_4_ * fVar21;
      fVar22 = auVar30._16_4_;
      auVar4._16_4_ = auVar17._16_4_ * fVar22;
      fVar23 = auVar30._20_4_;
      auVar4._20_4_ = auVar17._20_4_ * fVar23;
      fVar24 = auVar30._24_4_;
      auVar4._24_4_ = auVar17._24_4_ * fVar24;
      auVar4._28_4_ = auVar17._28_4_;
      auVar4 = vsubps_avx(auVar36,auVar4);
      auVar18._0_4_ = fVar12 + fVar12 * auVar4._0_4_;
      auVar18._4_4_ = fVar19 + fVar19 * auVar4._4_4_;
      auVar18._8_4_ = fVar20 + fVar20 * auVar4._8_4_;
      auVar18._12_4_ = fVar21 + fVar21 * auVar4._12_4_;
      auVar18._16_4_ = fVar22 + fVar22 * auVar4._16_4_;
      auVar18._20_4_ = fVar23 + fVar23 * auVar4._20_4_;
      auVar18._24_4_ = fVar24 + fVar24 * auVar4._24_4_;
      auVar18._28_4_ = auVar30._28_4_ + auVar4._28_4_;
      *pauVar6 = auVar18;
      pauVar6 = pauVar6 + 1;
      lVar9 = lVar9 + 8;
    }
    for (; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar34._0_8_ = *(ulong *)*pauVar6 ^ 0x8000000080000000;
      auVar34._8_4_ = *(uint *)(*pauVar6 + 8) ^ 0x80000000;
      auVar34._12_4_ = *(uint *)(*pauVar6 + 0xc) ^ 0x80000000;
      auVar26._8_4_ = 0x42b0c0a5;
      auVar26._0_8_ = 0x42b0c0a542b0c0a5;
      auVar26._12_4_ = 0x42b0c0a5;
      auVar25 = vminps_avx(auVar34,auVar26);
      auVar27._8_4_ = 0xc2b0c0a5;
      auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._12_4_ = 0xc2b0c0a5;
      auVar13 = vmaxps_avx(auVar25,auVar27);
      auVar28._0_4_ = auVar13._0_4_ * 1.442695 + 0.5;
      auVar28._4_4_ = auVar13._4_4_ * 1.442695 + 0.5;
      auVar28._8_4_ = auVar13._8_4_ * 1.442695 + 0.5;
      auVar28._12_4_ = auVar13._12_4_ * 1.442695 + 0.5;
      auVar35._0_4_ = (int)auVar28._0_4_;
      auVar35._4_4_ = (int)auVar28._4_4_;
      auVar35._8_4_ = (int)auVar28._8_4_;
      auVar35._12_4_ = (int)auVar28._12_4_;
      auVar34 = vcvtdq2ps_avx(auVar35);
      auVar25 = vcmpps_avx(auVar28,auVar34,1);
      auVar25 = vandps_avx(auVar25,auVar37);
      auVar25 = vsubps_avx(auVar34,auVar25);
      fVar12 = auVar13._0_4_ + auVar25._0_4_ * -0.6931472;
      fVar19 = auVar13._4_4_ + auVar25._4_4_ * -0.6931472;
      fVar20 = auVar13._8_4_ + auVar25._8_4_ * -0.6931472;
      fVar21 = auVar13._12_4_ + auVar25._12_4_ * -0.6931472;
      auVar29._0_4_ = (int)auVar25._0_4_;
      auVar29._4_4_ = (int)auVar25._4_4_;
      auVar29._8_4_ = (int)auVar25._8_4_;
      auVar29._12_4_ = (int)auVar25._12_4_;
      auVar25 = vpslld_avx(auVar29,0x17);
      auVar25 = vpaddd_avx(auVar25,auVar37);
      auVar13._0_4_ =
           (fVar12 + auVar38._0_4_ +
           fVar12 * fVar12 *
           (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
             0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar25._0_4_ + auVar38._0_4_;
      auVar13._4_4_ =
           (fVar19 + auVar38._4_4_ +
           fVar19 * fVar19 *
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar25._4_4_ + auVar38._4_4_;
      auVar13._8_4_ =
           (fVar20 + auVar38._8_4_ +
           fVar20 * fVar20 *
           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
             0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar25._8_4_ + auVar38._8_4_;
      auVar13._12_4_ =
           (fVar21 + auVar38._12_4_ +
           fVar21 * fVar21 *
           (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
             0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar25._12_4_ + auVar38._12_4_;
      auVar25 = vrcpps_avx(auVar13);
      fVar12 = auVar25._0_4_;
      auVar14._0_4_ = auVar13._0_4_ * fVar12;
      fVar19 = auVar25._4_4_;
      auVar14._4_4_ = auVar13._4_4_ * fVar19;
      fVar20 = auVar25._8_4_;
      auVar14._8_4_ = auVar13._8_4_ * fVar20;
      fVar21 = auVar25._12_4_;
      auVar14._12_4_ = auVar13._12_4_ * fVar21;
      auVar25 = vsubps_avx(auVar37,auVar14);
      auVar15._0_4_ = fVar12 + fVar12 * auVar25._0_4_;
      auVar15._4_4_ = fVar19 + fVar19 * auVar25._4_4_;
      auVar15._8_4_ = fVar20 + fVar20 * auVar25._8_4_;
      auVar15._12_4_ = fVar21 + fVar21 * auVar25._12_4_;
      *(undefined1 (*) [16])*pauVar6 = auVar15;
      pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
      lVar9 = lVar9 + 4;
    }
    lVar5 = sVar3 * sVar2 * uVar11;
    for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
      fVar12 = expf(-*(float *)((long)pvVar1 + lVar9 * 4 + lVar5));
      auVar38 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar1 + lVar9 * 4 + lVar5) = 1.0 / (fVar12 + 1.0);
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}